

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O3

quad_value_bit_vector *
bsim::quad_value_bit_vector_operations::lor
          (quad_value_bit_vector *__return_storage_ptr__,quad_value_bit_vector *a,
          quad_value_bit_vector *b)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uchar uVar4;
  
  quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,a->N);
  if (0 < a->N) {
    lVar3 = 0;
    do {
      bVar1 = (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar3].value;
      if (bVar1 == 3) {
        __assert_fail("!a.is_high_impedance()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xb8,"quad_value bsim::operator|(const quad_value &, const quad_value &)");
      }
      bVar2 = (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar3].value;
      if (bVar2 == 3) {
        __assert_fail("!b.is_high_impedance()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xb9,"quad_value bsim::operator|(const quad_value &, const quad_value &)");
      }
      if (bVar1 < 2) {
        uVar4 = '\x01';
        if (bVar1 != 1) {
          if (bVar2 < 2) {
            uVar4 = bVar2 == 1;
          }
          else {
            uVar4 = '\x02';
            if (bVar2 != 2) {
              __assert_fail("b.is_binary()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                            ,199,
                            "quad_value bsim::operator|(const quad_value &, const quad_value &)");
            }
          }
        }
      }
      else if (bVar2 < 2) {
        uVar4 = '\x01';
        if ((bVar2 != 1) && (uVar4 = '\x02', bVar1 != 2)) {
LAB_0018890e:
          __assert_fail("a.is_binary()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0xc6,"quad_value bsim::operator|(const quad_value &, const quad_value &)");
        }
      }
      else {
        uVar4 = '\x02';
        if (bVar2 != 2 && bVar1 != 2) goto LAB_0018890e;
      }
      (__return_storage_ptr__->bits).
      super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3].value = uVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 < a->N);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline quad_value_bit_vector lor(const quad_value_bit_vector& a,
					 const quad_value_bit_vector& b) {
      quad_value_bit_vector a_or_b(a.bitLength());
      for (int i = 0; i < a.bitLength(); i++) {
  	a_or_b.set(i, a.get(i) | b.get(i));
      }
      return a_or_b;
    }